

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsTextItem::QGraphicsTextItem(QGraphicsTextItem *this,QString *text,QGraphicsItem *parent)

{
  long lVar1;
  bool bVar2;
  QGraphicsObject *this_00;
  void *pvVar3;
  undefined8 *in_RDI;
  undefined1 enabled;
  long in_FS_OFFSET;
  QGraphicsItem *in_stack_000000e8;
  GraphicsItemFlags in_stack_0000012c;
  undefined4 in_stack_ffffffffffffffa8;
  GraphicsItemFlag in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar4;
  QGraphicsItemPrivate *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QGraphicsObject *)operator_new(0x178);
  QGraphicsItemPrivate::QGraphicsItemPrivate
            ((QGraphicsItemPrivate *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  QGraphicsObject::QGraphicsObject
            (this_00,in_stack_ffffffffffffffb8,
             (QGraphicsItem *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  *in_RDI = &PTR_metaObject_00d32eb8;
  in_RDI[2] = &PTR__QGraphicsTextItem_00d33010;
  pvVar3 = operator_new(0x38);
  QGraphicsTextItemPrivate::QGraphicsTextItemPrivate
            ((QGraphicsTextItemPrivate *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  in_RDI[4] = pvVar3;
  *(undefined8 **)(in_RDI[4] + 0x30) = in_RDI;
  bVar2 = QString::isEmpty((QString *)0x98b3d6);
  if (!bVar2) {
    setPlainText((QGraphicsTextItem *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (QString *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  enabled = (undefined1)((ulong)(in_RDI + 2) >> 0x38);
  uVar4 = 1;
  QGraphicsItem::setAcceptDrops
            ((QGraphicsItem *)CONCAT44(1,in_stack_ffffffffffffffb0),
             SUB41(in_stack_ffffffffffffffac >> 0x18,0));
  QGraphicsItem::setAcceptHoverEvents((QGraphicsItem *)this_00,(bool)enabled);
  QFlags<QGraphicsItem::GraphicsItemFlag>::QFlags
            ((QFlags<QGraphicsItem::GraphicsItemFlag> *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac);
  QGraphicsItem::setFlags(in_stack_000000e8,in_stack_0000012c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsTextItem::QGraphicsTextItem(const QString &text, QGraphicsItem *parent)
    : QGraphicsObject(*new QGraphicsItemPrivate, parent),
      dd(new QGraphicsTextItemPrivate)
{
    dd->qq = this;
    if (!text.isEmpty())
        setPlainText(text);
    setAcceptDrops(true);
    setAcceptHoverEvents(true);
    setFlags(ItemUsesExtendedStyleOption);
}